

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

void jsonrpccxx::check_param_type<category>(size_t index,json *x,value_t expectedType,type *param_4)

{
  value_t vVar1;
  JsonRpcException *this;
  value_t t;
  value_t t_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  string local_d8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  type *local_28;
  type *param_3_local;
  json *pjStack_18;
  value_t expectedType_local;
  json *x_local;
  size_t index_local;
  
  local_28 = param_4;
  param_3_local._7_1_ = expectedType;
  pjStack_18 = x;
  x_local = (json *)index;
  vVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::type(x);
  if (vVar1 != param_3_local._7_1_) {
    this = (JsonRpcException *)__cxa_allocate_exception(0x60);
    type_name_abi_cxx11_(&local_a8,(jsonrpccxx *)(ulong)param_3_local._7_1_,t);
    std::operator+(&local_88,"invalid parameter: must be ",&local_a8);
    std::operator+(&local_68,&local_88,", but is ");
    vVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::type(pjStack_18);
    type_name_abi_cxx11_(&local_d8,(jsonrpccxx *)(ulong)vVar1,t_00);
    std::operator+(&local_48,&local_68,&local_d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_e8,(unsigned_long *)&x_local);
    JsonRpcException::JsonRpcException(this,-0x7f5a,&local_48,&local_e8);
    __cxa_throw(this,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
  }
  return;
}

Assistant:

inline void check_param_type(size_t index, const json &x, json::value_t expectedType, typename std::enable_if<!std::is_arithmetic<T>::value>::type * = 0) {
    if (x.type() != expectedType) {
      throw JsonRpcException(invalid_params, "invalid parameter: must be " + type_name(expectedType) + ", but is " + type_name(x.type()), index);
    }
  }